

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs.c
# Opt level: O1

int luv_fs_write(lua_State *L)

{
  int iVar1;
  int iVar2;
  lua_Integer lVar3;
  uv_buf_t *bufs;
  uv_fs_t *req;
  luv_req_t *plVar4;
  uv_loop_t *loop;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  code *cb;
  size_t *count_00;
  size_t count;
  undefined8 local_50;
  lua_Integer local_48;
  uv_buf_t local_40;
  
  lVar3 = luaL_checkinteger(L,1);
  iVar1 = lua_type(L,2);
  if (iVar1 == 5) {
    bufs = luv_prep_bufs(L,(int)&local_50,count_00);
    local_40.base = (char *)0x0;
  }
  else {
    iVar1 = lua_isstring(L,2);
    if (iVar1 == 0) {
      iVar1 = luaL_argerror(L,2,"data must be string or table of strings");
      return iVar1;
    }
    local_40.base = luaL_checklstring(L,2,&local_40.len);
    local_50 = 1;
    bufs = (uv_buf_t *)0x0;
  }
  local_48 = luaL_checkinteger(L,3);
  iVar1 = luv_check_continuation(L,4);
  req = (uv_fs_t *)lua_newuserdata(L,0x1b8);
  plVar4 = luv_setup_req(L,iVar1);
  req->data = plVar4;
  req->ptr = local_40.base;
  plVar4->data = bufs;
  iVar1 = plVar4->callback_ref;
  loop = luv_loop(L);
  if (bufs == (uv_buf_t *)0x0) {
    bufs = &local_40;
  }
  cb = (uv_fs_cb)0x0;
  if (iVar1 != -2) {
    cb = luv_fs_cb;
  }
  iVar2 = uv_fs_write(loop,req,(uv_file)lVar3,bufs,(uint)local_50,local_48,cb);
  if ((req->fs_type == UV_FS_ACCESS) || (-1 < iVar2)) {
    if (iVar1 == -2) {
      iVar1 = push_fs_result(L,req);
      if (req->fs_type != UV_FS_SCANDIR) {
        luv_cleanup_req(L,(luv_req_t *)req->data);
        req->data = (void *)0x0;
        uv_fs_req_cleanup(req);
      }
    }
    else {
      lua_rawgeti(L,-0xf4628,(long)plVar4->req_ref);
      iVar1 = 1;
    }
  }
  else {
    lua_pushnil(L);
    pcVar7 = req->path;
    pcVar5 = uv_err_name((int)req->result);
    pcVar6 = uv_strerror((int)req->result);
    if (pcVar7 == (char *)0x0) {
      lua_pushfstring(L,"%s: %s",pcVar5,pcVar6);
    }
    else {
      lua_pushfstring(L,"%s: %s: %s",pcVar5,pcVar6,req->path);
    }
    pcVar7 = uv_err_name((int)req->result);
    lua_pushstring(L,pcVar7);
    luv_cleanup_req(L,(luv_req_t *)req->data);
    req->data = (void *)0x0;
    uv_fs_req_cleanup(req);
    iVar1 = 3;
  }
  return iVar1;
}

Assistant:

static int luv_fs_write(lua_State* L) {
  luv_ctx_t* ctx = luv_context(L);
  uv_file file = luaL_checkinteger(L, 1);
  int64_t offset = luaL_checkinteger(L, 3);
  int ref = luv_check_continuation(L, 4);
  uv_fs_t* req = (uv_fs_t*)lua_newuserdata(L, sizeof(*req));
  req->data = luv_setup_req(L, ctx, ref);
  size_t count;
  uv_buf_t* bufs = luv_check_bufs(L, 2, &count, (luv_req_t*)req->data);
  int nargs;
  FS_CALL_NORETURN(write, req, file, bufs, count, offset);
  free(bufs);
  return nargs;
}